

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CodeGeneratorRequest::MergePartialFromCodedStream
          (CodeGeneratorRequest *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  void *pvVar4;
  uint8 *puVar5;
  Arena *this_02;
  char *data;
  bool bVar6;
  uint32 uVar7;
  uint uVar8;
  int iVar9;
  Type *this_03;
  Version *this_04;
  pair<int,_int> pVar10;
  string *psVar11;
  Type *pTVar12;
  UnknownFieldSet *unknown_fields;
  Rep *pRVar13;
  char cVar14;
  uint tag;
  ulong uVar15;
  
  this_00 = &this->parameter_;
  this_01 = &this->file_to_generate_;
LAB_0023c07e:
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0023c0a2;
      input->buffer_ = pbVar3 + 1;
      uVar15 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0023c0a2:
      uVar7 = io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar15 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar15 = 0x100000000;
      }
      uVar15 = uVar7 | uVar15;
    }
    tag = (uint)uVar15;
    if ((uVar15 & 0x100000000) == 0) goto LAB_0023c0c4;
    uVar8 = (uint)(uVar15 >> 3) & 0x1fffffff;
    cVar14 = (char)uVar15;
    if (uVar8 < 3) {
      if (uVar8 == 1) {
        if (cVar14 == '\n') {
          pRVar13 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar13 == (Rep *)0x0) {
            iVar9 = (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_;
LAB_0023c2ef:
            internal::RepeatedPtrFieldBase::Reserve(&this_01->super_RepeatedPtrFieldBase,iVar9 + 1);
            pRVar13 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
            iVar9 = pRVar13->allocated_size;
LAB_0023c301:
            pRVar13->allocated_size = iVar9 + 1;
            this_02 = (this_01->super_RepeatedPtrFieldBase).arena_;
            if (this_02 == (Arena *)0x0) {
              psVar11 = (string *)operator_new(0x20);
              (psVar11->_M_dataplus)._M_p = (pointer)&psVar11->field_2;
              psVar11->_M_string_length = 0;
              (psVar11->field_2)._M_local_buf[0] = '\0';
            }
            else {
              psVar11 = (string *)
                        Arena::AllocateAligned
                                  (this_02,(type_info *)&std::__cxx11::string::typeinfo,0x20);
              (psVar11->_M_dataplus)._M_p = (pointer)&psVar11->field_2;
              psVar11->_M_string_length = 0;
              (psVar11->field_2)._M_local_buf[0] = '\0';
              Arena::AddListNode(this_02,psVar11,
                                 internal::arena_destruct_object<std::__cxx11::string>);
              pRVar13 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
            }
            iVar9 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
            (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar9 + 1;
            pRVar13->elements[iVar9] = psVar11;
          }
          else {
            iVar2 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
            iVar9 = pRVar13->allocated_size;
            if (iVar9 <= iVar2) {
              if (iVar9 == (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0023c2ef;
              goto LAB_0023c301;
            }
            (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            psVar11 = (string *)pRVar13->elements[iVar2];
          }
          bVar6 = internal::WireFormatLite::ReadBytes(input,psVar11);
          if (!bVar6) {
            return false;
          }
          pTVar12 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&this_01->super_RepeatedPtrFieldBase,
                               (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ +
                               -1);
          data = (pTVar12->_M_dataplus)._M_p;
          pTVar12 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&this_01->super_RepeatedPtrFieldBase,
                               (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ +
                               -1);
          internal::WireFormatLite::VerifyUtf8String
                    (data,(int)pTVar12->_M_string_length,PARSE,
                     "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
          goto LAB_0023c07e;
        }
      }
      else if ((uVar8 == 2) && (cVar14 == '\x12')) {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        psVar11 = (this->parameter_).ptr_;
        if (psVar11 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar11 = this_00->ptr_;
        }
        bVar6 = internal::WireFormatLite::ReadBytes(input,psVar11);
        if (!bVar6) {
          return false;
        }
        internal::WireFormatLite::VerifyUtf8String
                  ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,PARSE,
                   "google.protobuf.compiler.CodeGeneratorRequest.parameter");
        goto LAB_0023c07e;
      }
LAB_0023c0c4:
      if (tag == 0) {
        return true;
      }
      if ((tag & 7) == 4) {
        return true;
      }
      pvVar4 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar4 & 1) == 0) {
        unknown_fields =
             internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
      }
      bVar6 = internal::WireFormat::SkipField(input,tag,unknown_fields);
    }
    else {
      if (uVar8 == 3) {
        if (cVar14 == '\x1a') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          this_04 = this->compiler_version_;
          if (this_04 == (Version *)0x0) {
            this_04 = (Version *)operator_new(0x30);
            Version::Version(this_04);
            this->compiler_version_ = this_04;
          }
          puVar5 = input->buffer_;
          if ((puVar5 < input->buffer_end_) && (iVar9 = (int)(char)*puVar5, -1 < iVar9)) {
            input->buffer_ = puVar5 + 1;
          }
          else {
            iVar9 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar9 < 0) {
              return false;
            }
          }
          pVar10 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar9);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar6 = Version::MergePartialFromCodedStream(this_04,input);
          goto LAB_0023c2b2;
        }
        goto LAB_0023c0c4;
      }
      if ((uVar8 != 0xf) || (cVar14 != 'z')) goto LAB_0023c0c4;
      this_03 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                          (&(this->proto_file_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (iVar9 = (int)(char)*puVar5, -1 < iVar9)) {
        input->buffer_ = puVar5 + 1;
      }
      else {
        iVar9 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar9 < 0) {
          return false;
        }
      }
      pVar10 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar9);
      if ((long)pVar10 < 0) {
        return false;
      }
      bVar6 = FileDescriptorProto::MergePartialFromCodedStream(this_03,input);
LAB_0023c2b2:
      if (bVar6 == false) {
        return false;
      }
      bVar6 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar10.first);
    }
    if (!bVar6) {
      return false;
    }
  } while( true );
}

Assistant:

bool CodeGeneratorRequest::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.compiler.CodeGeneratorRequest)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated string file_to_generate = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_file_to_generate()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->file_to_generate(this->file_to_generate_size() - 1).data(),
            this->file_to_generate(this->file_to_generate_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string parameter = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_parameter()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->parameter().data(), this->parameter().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.compiler.CodeGeneratorRequest.parameter");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.compiler.Version compiler_version = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_compiler_version()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_proto_file()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.compiler.CodeGeneratorRequest)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.compiler.CodeGeneratorRequest)
  return false;
#undef DO_
}